

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_extract(zip_t *zip,
                     _func_size_t_void_ptr_unsigned_long_long_void_ptr_size_t *on_extract,void *arg)

{
  mz_bool mVar1;
  mz_uint idx;
  mz_zip_archive *pzip;
  void *arg_local;
  _func_size_t_void_ptr_unsigned_long_long_void_ptr_size_t *on_extract_local;
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) && (-1 < (zip->entry).index)) {
    mVar1 = mz_zip_reader_extract_to_callback
                      (&zip->archive,(zip->entry).index,(mz_file_write_func)on_extract,arg,0);
    zip_local._4_4_ = -1;
    if (mVar1 != 0) {
      zip_local._4_4_ = 0;
    }
  }
  else {
    zip_local._4_4_ = -1;
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_extract(struct zip_t *zip,
                      size_t (*on_extract)(void *arg, unsigned long long offset,
                                           const void *buf, size_t bufsize),
                      void *arg) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING || zip->entry.index < 0) {
    // the entry is not found or we do not have read access
    return -1;
  }

  idx = (mz_uint)zip->entry.index;
  return (mz_zip_reader_extract_to_callback(pzip, idx, on_extract, arg, 0))
             ? 0
             : -1;
}